

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::ISOYearOperator>
               (interval_t *ldata,long *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  date_t input;
  date_t input_00;
  int32_t iVar6;
  int32_t iVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  reference pvVar10;
  LogicalType *other;
  ValidityMask *unaff_RBX;
  sel_t *unaff_RBP;
  buffer_ptr<ValidityBuffer> *unaff_R12;
  ulong unaff_R13;
  idx_t idx_in_entry;
  ValidityMask *unaff_R14;
  interval_t input_01;
  Value VStack_128;
  LogicalType LStack_e8;
  BaseStatistics BStack_d0;
  ValidityMask *pVStack_78;
  buffer_ptr<ValidityBuffer> *pbStack_70;
  ulong uStack_68;
  ValidityMask *pVStack_60;
  idx_t iStack_58;
  sel_t *psStack_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  pointer local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count == 0) {
      return;
    }
LAB_01a5beae:
    psStack_50 = (sel_t *)0x1a5beb3;
    input_01.micros = (int64_t)result_data;
    input_01._0_8_ = ldata;
    DatePart::ISOYearOperator::Operation<duckdb::interval_t,long>(input_01);
    pVStack_78 = unaff_RBX;
    pbStack_70 = unaff_R12;
    uStack_68 = unaff_R13;
    pVStack_60 = unaff_R14;
    iStack_58 = count;
    psStack_50 = unaff_RBP;
    pvVar10 = vector<duckdb::BaseStatistics,_true>::operator[]
                        ((vector<duckdb::BaseStatistics,_true> *)result_data,0);
    bVar5 = NumericStats::HasMinMax(pvVar10);
    if (bVar5) {
      input = NumericStats::GetMin<duckdb::date_t>(pvVar10);
      input_00 = NumericStats::GetMax<duckdb::date_t>(pvVar10);
      if (((input.days <= input_00.days) && (bVar5 = Value::IsFinite<duckdb::date_t>(input), bVar5))
         && (bVar5 = Value::IsFinite<duckdb::date_t>(input_00), bVar5)) {
        iVar6 = Date::ExtractISOYearNumber(input);
        iVar7 = Date::ExtractISOYearNumber(input_00);
        LogicalType::LogicalType(&LStack_e8,other);
        NumericStats::CreateEmpty(&BStack_d0,&LStack_e8);
        LogicalType::~LogicalType(&LStack_e8);
        Value::Value(&VStack_128,(long)iVar6);
        NumericStats::SetMin(&BStack_d0,&VStack_128);
        Value::~Value(&VStack_128);
        Value::Value(&VStack_128,(long)iVar7);
        NumericStats::SetMax(&BStack_d0,&VStack_128);
        Value::~Value(&VStack_128);
        pvVar10 = vector<duckdb::BaseStatistics,_true>::operator[]
                            ((vector<duckdb::BaseStatistics,_true> *)result_data,0);
        BaseStatistics::CopyValidity(&BStack_d0,pvVar10);
        BaseStatistics::ToUnique((BaseStatistics *)ldata);
        BaseStatistics::~BaseStatistics(&BStack_d0);
        return;
      }
    }
    (((BaseStatistics *)ldata)->type).id_ = INVALID;
    (((BaseStatistics *)ldata)->type).physical_type_ = ~INVALID;
    *(undefined6 *)&(((BaseStatistics *)ldata)->type).field_0x2 = 0;
    return;
  }
  if (count != 0) {
    unaff_RBP = sel_vector->sel_vector;
    unaff_R12 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    unaff_R13 = 0;
    do {
      uVar8 = unaff_R13;
      if (unaff_RBP != (sel_t *)0x0) {
        uVar8 = (ulong)unaff_RBP[unaff_R13];
      }
      unaff_RBX = result_mask;
      unaff_R14 = mask;
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar8 >> 6] >>
           (uVar8 & 0x3f) & 1) != 0) goto LAB_01a5beae;
      if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
          (unsigned_long *)0x0) {
        local_38 = (pointer)(result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
        result_data = (long *)&local_38;
        psStack_50 = (sel_t *)0x1a5be37;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_48,(unsigned_long *)result_data);
        p_Var4 = p_Stack_40;
        peVar3 = local_48;
        local_48 = (element_type *)0x0;
        p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar3;
        (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var4;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          psStack_50 = (sel_t *)0x1a5be54;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          psStack_50 = (sel_t *)0x1a5be63;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
        }
        psStack_50 = (sel_t *)0x1a5be6b;
        ldata = (interval_t *)unaff_R12;
        pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                           (unaff_R12);
        (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
             (unsigned_long *)
             (pTVar9->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
      }
      bVar2 = (byte)unaff_R13 & 0x3f;
      puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
               (unaff_R13 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      unaff_R13 = unaff_R13 + 1;
    } while (count != unaff_R13);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}